

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall minja::Value::operator/(Value *this,Value *rhs)

{
  bool bVar1;
  Value *in_RDI;
  Value *this_00;
  Value *unaff_retaddr;
  double *in_stack_ffffffffffffffa8;
  Value *in_stack_ffffffffffffffb0;
  
  bVar1 = is_number_integer((Value *)0x318cef);
  if ((bVar1) && (bVar1 = is_number_integer((Value *)0x318cff), bVar1)) {
    get<long>(unaff_retaddr);
    get<long>(unaff_retaddr);
    Value(in_stack_ffffffffffffffb0,(int64_t *)in_stack_ffffffffffffffa8);
  }
  else {
    this_00 = (Value *)get<double>(unaff_retaddr);
    get<double>(unaff_retaddr);
    Value(this_00,in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

Value operator/(const Value& rhs) const {
      if (is_number_integer() && rhs.is_number_integer())
        return get<int64_t>() / rhs.get<int64_t>();
      else
        return get<double>() / rhs.get<double>();
  }